

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsubwins.cpp
# Opt level: O1

void test_reparent1(void)

{
  undefined8 in_RAX;
  undefined8 extraout_RDX;
  
  printf("Hit RETURN to make D3 a sibling of D2:");
  getchar();
  (**(code **)(*(long *)d3 + 0x18))(d3,d1);
  printf("Hit RETURN to put D3 back where it was:");
  getchar();
  (**(code **)(*(long *)d3 + 0x18))(d3,d2);
  printf("Hit RETURN to make D2 a top-level window:");
  getchar();
  (**(code **)(*(long *)d2 + 0x18))(d2,root);
  printf("Hit RETURN to put D2 back where it was:");
  getchar();
  (**(code **)(*(long *)d2 + 0x18))(d2,d1,extraout_RDX,in_RAX);
  return;
}

Assistant:

void
test_reparent1()
{

  printf("Hit RETURN to make D3 a sibling of D2:");
  getchar();
  d3->Reparent(d1);

  printf("Hit RETURN to put D3 back where it was:");
  getchar();
  d3->Reparent(d2);

  printf("Hit RETURN to make D2 a top-level window:");
  getchar();
  d2->Reparent(root);

  printf("Hit RETURN to put D2 back where it was:");
  getchar();
  d2->Reparent(d1);
}